

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::invalidateSolution(Highs *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0xed4) = 0;
  *(undefined4 *)(in_RDI + 0xed8) = 0;
  *(undefined4 *)(in_RDI + 0xf00) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0xf08) = 0x7ff0000000000000;
  *(undefined8 *)(in_RDI + 0xf10) = 0x7ff0000000000000;
  *(undefined4 *)(in_RDI + 0xf18) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0xf20) = 0x7ff0000000000000;
  *(undefined8 *)(in_RDI + 0xf28) = 0x7ff0000000000000;
  HighsSolution::invalidate((HighsSolution *)(in_RDI + 8));
  return;
}

Assistant:

void Highs::invalidateSolution() {
  info_.primal_solution_status = kSolutionStatusNone;
  info_.dual_solution_status = kSolutionStatusNone;
  info_.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  this->solution_.invalidate();
}